

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O2

void accum_global_gauden_dnom
               (float32 ***dnom,float32 ***l_dnom,gauden_t *g,uint32 *lcl2glb,uint32 n_lcl2glb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (dnom != (float32 ***)0x0) {
    uVar1 = g->n_feat;
    uVar2 = g->n_density;
    for (uVar5 = 0; uVar5 != n_lcl2glb; uVar5 = uVar5 + 1) {
      uVar3 = lcl2glb[uVar5];
      for (uVar6 = 0; uVar6 != uVar1; uVar6 = uVar6 + 1) {
        for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
          dnom[uVar3][uVar6][uVar4] =
               (float32)((float)l_dnom[uVar5][uVar6][uVar4] + (float)dnom[uVar3][uVar6][uVar4]);
        }
      }
    }
    return;
  }
  err_msg(ERR_WARN,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
          ,0x19e,"accum_global_gauden_dnom() called with NULL dnom\n");
  return;
}

Assistant:

void
accum_global_gauden_dnom(float32 ***dnom,
			 float32 ***l_dnom,
			 gauden_t *g,
			 uint32 *lcl2glb,
			 uint32 n_lcl2glb)
{
    uint32 n_feat;
    uint32 n_density;
    uint32 ii, i, j, k;

    if (dnom == NULL) {
	/* nothing to do */
	E_WARN("accum_global_gauden_dnom() called with NULL dnom\n");
	return;
    }

    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    for (ii = 0; ii < n_lcl2glb; ii++) {
	i = lcl2glb[ii];	/* find out the global id */
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		/* accumulate the local posterior into the global one */
		dnom[i][j][k] += l_dnom[ii][j][k];
	    }
	}
    }
}